

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O3

vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> * __thiscall
cmGeneratorExpressionLexer::Tokenize
          (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           *__return_storage_ptr__,cmGeneratorExpressionLexer *this,string *input)

{
  byte bVar1;
  long lVar2;
  byte *upto;
  anon_enum_32 local_3c;
  byte *local_38;
  size_type local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = std::__cxx11::string::find((char)input,0x24);
  if (lVar2 == -1) {
    local_3c = Text;
    local_38 = (byte *)(input->_M_dataplus)._M_p;
    local_30 = input->_M_string_length;
    std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
    emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*,unsigned_long>
              ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
               __return_storage_ptr__,&local_3c,(char **)&local_38,&local_30);
    return __return_storage_ptr__;
  }
  local_38 = (byte *)(input->_M_dataplus)._M_p;
  upto = local_38;
  do {
    bVar1 = *local_38;
    if (bVar1 < 0x3a) {
      if (bVar1 == 0x24) {
        if (local_38[1] == 0x3c) {
          InsertText((char *)upto,(char *)local_38,__return_storage_ptr__);
          local_30 = CONCAT44(local_30._4_4_,1);
          local_3c = EndExpression;
          std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
          emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                    ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>
                      *)__return_storage_ptr__,(anon_enum_32 *)&local_30,(char **)&local_38,
                     (int *)&local_3c);
          upto = local_38 + 2;
          local_38 = local_38 + 1;
          this->SawBeginExpression = true;
        }
      }
      else {
        if (bVar1 == 0x2c) {
          InsertText((char *)upto,(char *)local_38,__return_storage_ptr__);
          local_30 = CONCAT44(local_30._4_4_,4);
          local_3c = BeginExpression;
          std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
          emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                    ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>
                      *)__return_storage_ptr__,(anon_enum_32 *)&local_30,(char **)&local_38,
                     (int *)&local_3c);
          goto LAB_003abad9;
        }
        if (bVar1 == 0) {
          InsertText((char *)upto,(char *)local_38,__return_storage_ptr__);
          return __return_storage_ptr__;
        }
      }
    }
    else if (bVar1 == 0x3a) {
      InsertText((char *)upto,(char *)local_38,__return_storage_ptr__);
      local_30 = CONCAT44(local_30._4_4_,3);
      local_3c = BeginExpression;
      std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
      emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
                 __return_storage_ptr__,(anon_enum_32 *)&local_30,(char **)&local_38,
                 (int *)&local_3c);
LAB_003abad9:
      upto = local_38 + 1;
    }
    else if (bVar1 == 0x3e) {
      InsertText((char *)upto,(char *)local_38,__return_storage_ptr__);
      local_30 = CONCAT44(local_30._4_4_,2);
      local_3c = BeginExpression;
      std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
      emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
                 __return_storage_ptr__,(anon_enum_32 *)&local_30,(char **)&local_38,
                 (int *)&local_3c);
      upto = local_38 + 1;
      this->SawGeneratorExpression = this->SawBeginExpression;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

std::vector<cmGeneratorExpressionToken> cmGeneratorExpressionLexer::Tokenize(
  const std::string& input)
{
  std::vector<cmGeneratorExpressionToken> result;

  if (input.find('$') == std::string::npos) {
    result.emplace_back(cmGeneratorExpressionToken::Text, input.c_str(),
                        input.size());
    return result;
  }

  const char* c = input.c_str();
  const char* upto = c;

  for (; *c; ++c) {
    switch (*c) {
      case '$':
        if (c[1] == '<') {
          InsertText(upto, c, result);
          result.emplace_back(cmGeneratorExpressionToken::BeginExpression, c,
                              2);
          upto = c + 2;
          ++c;
          SawBeginExpression = true;
        }
        break;
      case '>':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::EndExpression, c, 1);
        upto = c + 1;
        SawGeneratorExpression = SawBeginExpression;
        break;
      case ':':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::ColonSeparator, c, 1);
        upto = c + 1;
        break;
      case ',':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::CommaSeparator, c, 1);
        upto = c + 1;
        break;
      default:
        break;
    }
  }
  InsertText(upto, c, result);

  return result;
}